

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void sga_dot_patch(Integer g_a,char *t_a,Integer *ailo,Integer *aihi,Integer *ajlo,Integer *ajhi,
                  Integer g_b,char *t_b,Integer *bilo,Integer *bihi,Integer *bjlo,Integer *bjhi,
                  void *retval)

{
  Integer bhi [2];
  Integer blo [2];
  Integer ahi [2];
  Integer alo [2];
  char *in_stack_000008e8;
  Integer in_stack_000008f0;
  Integer *in_stack_000008f8;
  Integer *in_stack_00000900;
  char *in_stack_00000908;
  Integer in_stack_00000910;
  Integer *in_stack_00000920;
  Integer *in_stack_00000928;
  void *in_stack_00000930;
  
  pnga_dot_patch(in_stack_00000910,in_stack_00000908,in_stack_00000900,in_stack_000008f8,
                 in_stack_000008f0,in_stack_000008e8,in_stack_00000920,in_stack_00000928,
                 in_stack_00000930);
  return;
}

Assistant:

static void sga_dot_patch(Integer g_a, char *t_a, Integer *ailo, Integer *aihi, Integer *ajlo, Integer *ajhi, Integer g_b, char *t_b, Integer *bilo, Integer *bihi, Integer *bjlo, Integer *bjhi, void *retval)
{
    Integer alo[2], ahi[2], blo[2], bhi[2];

    alo[0] = *ailo; alo[1] = *ajlo;
    ahi[0] = *aihi; ahi[1] = *ajhi;
    blo[0] = *bilo; blo[1] = *bjlo;
    bhi[0] = *bihi; bhi[1] = *bjhi;
    wnga_dot_patch(g_a, t_a, alo, ahi, g_b, t_b, blo, bhi, retval);
}